

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O2

APInt * __thiscall llvm::APInt::operator+=(APInt *this,uint64_t RHS)

{
  APInt *pAVar1;
  
  if ((ulong)this->BitWidth < 0x41) {
    (this->U).pVal = (uint64_t *)((long)(this->U).pVal + RHS);
  }
  else {
    tcAddPart((this->U).pVal,RHS,(uint)((ulong)this->BitWidth + 0x3f >> 6));
  }
  pAVar1 = clearUnusedBits(this);
  return pAVar1;
}

Assistant:

APInt& APInt::operator+=(uint64_t RHS) {
  if (isSingleWord())
    U.VAL += RHS;
  else
    tcAddPart(U.pVal, RHS, getNumWords());
  return clearUnusedBits();
}